

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O3

size_t score(decks_t *result,size_t p1,size_t p2)

{
  char *__s;
  iterator iVar1;
  size_t sVar2;
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file;
  ostream *poVar3;
  size_t sVar4;
  uint *puVar5;
  long lVar6;
  uint uVar7;
  __hashtable *__h;
  char **argv;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  size_t winner;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_deck_t>,_false>_>_>
  _Stack_3f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_3e8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_3d0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_398;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_360;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_328;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_2f0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_2b8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_280;
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_> _Stack_248;
  decks_t *pdStack_38;
  code *pcStack_30;
  char *local_20;
  char *local_18;
  
  argv = &local_20;
  pcStack_30 = (code *)0x1033b0;
  local_20 = (char *)p1;
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&result->_M_h,(key_type *)argv);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>._M_cur !=
      (__node_type *)0x0) {
    if (*(long *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>.
                        _M_cur + 0x48) !=
        *(long *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>.
                        _M_cur + 0x28)) {
      p2 = (size_t)local_20;
    }
    argv = &local_18;
    pcStack_30 = (code *)0x1033d8;
    local_18 = (char *)p2;
    iVar1 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&result->_M_h,(key_type *)argv);
    if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>._M_cur !=
        (__node_type *)0x0) {
      lVar10 = *(long *)((long)iVar1.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>
                               ._M_cur + 0x48);
      if (lVar10 == *(long *)((long)iVar1.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>
                                    ._M_cur + 0x28)) {
        sVar2 = 0;
      }
      else {
        lVar8 = *(long *)((long)iVar1.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>
                                ._M_cur + 0x50);
        lVar6 = *(long *)((long)iVar1.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>
                                ._M_cur + 0x60);
        lVar11 = 1;
        sVar2 = 0;
        do {
          if (lVar10 == lVar8) {
            lVar8 = *(long *)(lVar6 + -8);
            lVar6 = lVar6 + -8;
            plVar12 = (long *)(lVar8 + 0x1f8);
            lVar10 = lVar8 + 0x200;
          }
          else {
            plVar12 = (long *)(lVar10 + -8);
          }
          sVar2 = sVar2 + *plVar12 * lVar11;
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + -8;
        } while (lVar10 != *(long *)((long)iVar1.
                                           super__Node_iterator_base<std::pair<const_unsigned_long,_deck_t>,_false>
                                           ._M_cur + 0x28));
      }
      return sVar2;
    }
  }
  iVar9 = 0x108216;
  pcStack_30 = main;
  std::__throw_out_of_range("_Map_base::at");
  pdStack_38 = result;
  pcStack_30 = (code *)p2;
  if (iVar9 == 2) {
    get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)&_Stack_248,2,
              argv);
    if (_Stack_248._M_index == '\0') {
      puVar5 = (uint *)std::get<0ul,int,std::ifstream>
                                 ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                                   *)&_Stack_248);
      uVar7 = *puVar5;
    }
    else {
      file = std::get<1ul,int,std::ifstream>
                       ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                        &_Stack_248);
      tokenize_abi_cxx11_<std::ifstream>(&vStack_3e8,file);
      read_decks((decks_t *)&_Stack_398,&vStack_3e8);
      _Stack_3d0._M_buckets = (__buckets_ptr)&_Stack_2b8;
      _Stack_2b8._M_buckets = (__buckets_ptr)0x0;
      _Stack_2b8._M_bucket_count = _Stack_398._M_bucket_count;
      _Stack_2b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      _Stack_2b8._M_element_count = _Stack_398._M_element_count;
      _Stack_2b8._M_rehash_policy._M_max_load_factor =
           _Stack_398._M_rehash_policy._M_max_load_factor;
      _Stack_2b8._M_rehash_policy._4_4_ = _Stack_398._M_rehash_policy._4_4_;
      _Stack_2b8._M_rehash_policy._M_next_resize = _Stack_398._M_rehash_policy._M_next_resize;
      _Stack_2b8._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,deck_t>,false>>>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)_Stack_3d0._M_buckets,&_Stack_398,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_deck_t>,_false>_>_>
                  *)&_Stack_3d0);
      play<void(*)(std::deque<unsigned_long,std::allocator<unsigned_long>>&,std::deque<unsigned_long,std::allocator<unsigned_long>>&)>
                ((decks_t *)&_Stack_280,(decks_t *)&_Stack_2b8,1,2,combat);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_2b8);
      _Stack_3d0._M_buckets = (__buckets_ptr)&_Stack_2f0;
      _Stack_2f0._M_buckets = (__buckets_ptr)0x0;
      _Stack_2f0._M_bucket_count = _Stack_280._M_bucket_count;
      _Stack_2f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      _Stack_2f0._M_element_count = _Stack_280._M_element_count;
      _Stack_2f0._M_rehash_policy._M_max_load_factor =
           _Stack_280._M_rehash_policy._M_max_load_factor;
      _Stack_2f0._M_rehash_policy._4_4_ = _Stack_280._M_rehash_policy._4_4_;
      _Stack_2f0._M_rehash_policy._M_next_resize = _Stack_280._M_rehash_policy._M_next_resize;
      _Stack_2f0._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,deck_t>,false>>>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)_Stack_3d0._M_buckets,&_Stack_280,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_deck_t>,_false>_>_>
                  *)&_Stack_3d0);
      score((decks_t *)&_Stack_2f0,1,2);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_2f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 1: ",8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      _Stack_3f0._M_h = (__hashtable_alloc *)&_Stack_328;
      _Stack_328._M_buckets = (__buckets_ptr)0x0;
      _Stack_328._M_bucket_count = _Stack_398._M_bucket_count;
      _Stack_328._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      _Stack_328._M_element_count = _Stack_398._M_element_count;
      _Stack_328._M_rehash_policy._M_max_load_factor =
           _Stack_398._M_rehash_policy._M_max_load_factor;
      _Stack_328._M_rehash_policy._4_4_ = _Stack_398._M_rehash_policy._4_4_;
      _Stack_328._M_rehash_policy._M_next_resize = _Stack_398._M_rehash_policy._M_next_resize;
      _Stack_328._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,deck_t>,false>>>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)_Stack_3f0._M_h,&_Stack_398,&_Stack_3f0);
      play<void(*)(std::deque<unsigned_long,std::allocator<unsigned_long>>&,std::deque<unsigned_long,std::allocator<unsigned_long>>&)>
                ((decks_t *)&_Stack_3d0,(decks_t *)&_Stack_328,1,2,recursive_combat);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_328);
      _Stack_3f0._M_h = (__hashtable_alloc *)&_Stack_360;
      _Stack_360._M_buckets = (__buckets_ptr)0x0;
      _Stack_360._M_bucket_count = _Stack_3d0._M_bucket_count;
      _Stack_360._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      _Stack_360._M_element_count = _Stack_3d0._M_element_count;
      _Stack_360._M_rehash_policy._M_max_load_factor =
           _Stack_3d0._M_rehash_policy._M_max_load_factor;
      _Stack_360._M_rehash_policy._4_4_ = _Stack_3d0._M_rehash_policy._4_4_;
      _Stack_360._M_rehash_policy._M_next_resize = _Stack_3d0._M_rehash_policy._M_next_resize;
      _Stack_360._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,deck_t>,false>>>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,deck_t>,std::allocator<std::pair<unsigned_long_const,deck_t>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)_Stack_3f0._M_h,&_Stack_3d0,&_Stack_3f0);
      score((decks_t *)&_Stack_360,1,2);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_360);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 2: ",8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_3d0);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_280);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_398);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_3e8);
      uVar7 = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
    ~_Variant_storage(&_Stack_248);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c8);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," {path-to-file}",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    uVar7 = 1;
  }
  return (ulong)uVar7;
}

Assistant:

size_t score(decks_t result, size_t p1, size_t p2) {
  auto winner = result.at(p1).cards.empty() ? p2 : p1;
  const auto& winner_deck = result.at(winner).cards;

  auto i = 1;
  return std::accumulate(winner_deck.crbegin(), winner_deck.crend(), uint64_t{0}, [&i](auto a, auto v){
    return a + v * (i++);
  });
}